

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.h
# Opt level: O1

void __thiscall
o3dgc::Arithmetic_Codec::ExpGolombEncode
          (Arithmetic_Codec *this,uint symbol,int k,Static_Bit_Model *bModel0,
          Adaptive_Bit_Model *bModel1)

{
  uint uVar1;
  
  uVar1 = 1 << ((byte)k & 0x1f);
  if (uVar1 <= symbol) {
    do {
      symbol = symbol - uVar1;
      encode(this,1,bModel1);
      k = k + 1;
      uVar1 = 1 << ((byte)k & 0x1f);
    } while (uVar1 <= symbol);
  }
  encode(this,0,bModel1);
  while (k != 0) {
    k = k - 1;
    encode(this,(uint)((symbol >> (k & 0x1fU) & 1) != 0),bModel0);
  }
  return;
}

Assistant:

void     ExpGolombEncode(unsigned int symbol, 
                               int k,
                               Static_Bit_Model & bModel0,
                               Adaptive_Bit_Model & bModel1)
               {
                   while(1)
                   {
                       if (symbol >= (unsigned int)(1<<k))
                       {
                           encode(1, bModel1);
                           symbol = symbol - (1<<k);
                           k++;
                       }
                       else
                       {
                           encode(0, bModel1); // now terminated zero of unary part
                           while (k--) // next binary part
                           {
                               encode((signed short)((symbol>>k)&1), bModel0);
                           }
                           break;
                       }
                   }
               }